

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode
scaling_SetUserParam
          (CUPDLPscaling *scaling,cupdlp_bool *ifChangeIntParam,cupdlp_int *intParam,
          cupdlp_bool *ifChangeFloatParam,cupdlp_float *floatParam)

{
  cupdlp_retcode retcode;
  cupdlp_float *floatParam_local;
  cupdlp_bool *ifChangeFloatParam_local;
  cupdlp_int *intParam_local;
  cupdlp_bool *ifChangeIntParam_local;
  CUPDLPscaling *scaling_local;
  
  if ((ifChangeIntParam[5] & 1U) != 0) {
    scaling->ifRuizScaling = intParam[5];
  }
  if ((ifChangeIntParam[6] & 1U) != 0) {
    scaling->ifL2Scaling = intParam[6];
  }
  if ((ifChangeIntParam[7] & 1U) != 0) {
    scaling->ifPcScaling = intParam[7];
  }
  return 0;
}

Assistant:

cupdlp_retcode scaling_SetUserParam(CUPDLPscaling *scaling,
                                    cupdlp_bool *ifChangeIntParam,
                                    cupdlp_int *intParam,
                                    cupdlp_bool *ifChangeFloatParam,
                                    cupdlp_float *floatParam) {
  cupdlp_retcode retcode = RETCODE_OK;

  if (ifChangeIntParam[IF_RUIZ_SCALING]) {
    scaling->ifRuizScaling = intParam[IF_RUIZ_SCALING];
  }

  if (ifChangeIntParam[IF_L2_SCALING]) {
    scaling->ifL2Scaling = intParam[IF_L2_SCALING];
  }

  if (ifChangeIntParam[IF_PC_SCALING]) {
    scaling->ifPcScaling = intParam[IF_PC_SCALING];
  }

exit_cleanup:
  return retcode;
}